

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

string * __thiscall leveldb::Status::ToString_abi_cxx11_(Status *this)

{
  Code CVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  char *type;
  string *result;
  uint32_t length;
  char tmp [30];
  Status *in_stack_ffffffffffffff68;
  allocator<char> *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char *this_01;
  allocator<char> local_2a;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)in_RSI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa8,
               (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_RSI);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    CVar1 = code(in_stack_ffffffffffffff68);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)CVar1;
    switch(this_00) {
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
      this_01 = "OK";
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
      this_01 = "NotFound: ";
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
      this_01 = "Corruption: ";
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
      this_01 = "Not implemented: ";
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
      this_01 = "Invalid argument: ";
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
      this_01 = "IO error: ";
      break;
    default:
      in_stack_ffffffffffffff70 = &local_28;
      CVar1 = code(in_stack_ffffffffffffff68);
      snprintf((char *)in_stack_ffffffffffffff70,0x1e,"Unknown code(%d): ",(ulong)CVar1);
      this_01 = (char *)&local_28;
    }
    uVar2 = 0;
    __n = &local_2a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),in_RSI);
    std::allocator<char>::~allocator(&local_2a);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,(char *)in_stack_ffffffffffffff70,(size_type)__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        snprintf(tmp, sizeof(tmp),
                 "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}